

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_load_pem_objects
              (char *pem_fname,char *label,ptls_iovec_t *list,size_t list_max,size_t *nb_objects)

{
  FILE *__stream;
  undefined1 local_68 [8];
  ptls_buffer_t buf;
  size_t count;
  int ret;
  FILE *F;
  size_t *nb_objects_local;
  size_t list_max_local;
  ptls_iovec_t *list_local;
  char *label_local;
  char *pem_fname_local;
  
  count._4_4_ = 0;
  buf.is_allocated = 0;
  buf._28_4_ = 0;
  __stream = fopen(pem_fname,"r");
  if (__stream == (FILE *)0x0) {
    count._4_4_ = -1;
  }
  *nb_objects = 0;
  if (count._4_4_ == 0) {
    while ((ulong)buf._24_8_ < list_max) {
      ptls_buffer_init((ptls_buffer_t *)local_68,"",0);
      count._4_4_ = ptls_get_pem_object((FILE *)__stream,label,(ptls_buffer_t *)local_68);
      if (count._4_4_ != 0) {
        ptls_buffer_dispose((ptls_buffer_t *)local_68);
        break;
      }
      if ((buf.capacity == 0) || ((int)buf.off == 0)) {
        ptls_buffer_dispose((ptls_buffer_t *)local_68);
      }
      else {
        list[buf._24_8_].base = (uint8_t *)local_68;
        list[buf._24_8_].len = buf.capacity;
        buf._24_8_ = buf._24_8_ + 1;
      }
    }
  }
  if ((count._4_4_ == 0x233) && (buf._24_8_ != 0)) {
    count._4_4_ = 0;
  }
  *nb_objects = buf._24_8_;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return count._4_4_;
}

Assistant:

int ptls_load_pem_objects(char const *pem_fname, const char *label, ptls_iovec_t *list, size_t list_max, size_t *nb_objects)
{
    FILE *F;
    int ret = 0;
    size_t count = 0;
#ifdef _WINDOWS
    errno_t err = fopen_s(&F, pem_fname, "r");
    if (err != 0) {
        ret = -1;
    }
#else
    F = fopen(pem_fname, "r");
    if (F == NULL) {
        ret = -1;
    }
#endif

    *nb_objects = 0;

    if (ret == 0) {
        while (count < list_max) {
            ptls_buffer_t buf;

            ptls_buffer_init(&buf, "", 0);

            ret = ptls_get_pem_object(F, label, &buf);

            if (ret == 0) {
                if (buf.off > 0 && buf.is_allocated) {
                    list[count].base = buf.base;
                    list[count].len = buf.off;
                    count++;
                } else {
                    ptls_buffer_dispose(&buf);
                }
            } else {
                ptls_buffer_dispose(&buf);
                break;
            }
        }
    }

    if (ret == PTLS_ERROR_PEM_LABEL_NOT_FOUND && count > 0) {
        ret = 0;
    }

    *nb_objects = count;

    if (F != NULL) {
        fclose(F);
    }

    return ret;
}